

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

int filterResources(int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
                   PairedList *possibleResources)

{
  size_t *psVar1;
  _List_node_base *__filename;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar5;
  ulong uVar6;
  _Self __tmp;
  long lVar7;
  int score;
  int iVar8;
  int iVar9;
  ulong uVar4;
  
  if (resourceCount == 0 || resourceList == (int *)0x0) {
    if (0 < rsrcList->length) {
      lVar7 = 0;
      do {
        iVar5 = 0x20;
        iVar8 = 0;
        iVar3 = 1;
        do {
          uVar4 = (ulong)iVar3;
          iVar3 = iVar3 * 2;
          iVar8 = iVar8 + (uint)((rsrcList->list[lVar7].supportFlags & uVar4) != 0 &&
                                (uVar4 & preferenceFlags) != 0);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        p_Var2 = (_List_node_base *)operator_new(0x18);
        p_Var2[1]._M_next = (_List_node_base *)((ulong)(uint)-iVar8 | lVar7 << 0x20);
        std::__detail::_List_node_base::_M_hook(p_Var2);
        psVar1 = &(possibleResources->
                  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 < rsrcList->length);
    }
  }
  else if (0 < resourceCount) {
    uVar4 = 0;
    do {
      iVar3 = resourceList[uVar4];
      iVar8 = 0x20;
      iVar9 = 0;
      iVar5 = 1;
      do {
        uVar6 = (ulong)iVar5;
        iVar5 = iVar5 * 2;
        iVar9 = iVar9 + (uint)((rsrcList->list[iVar3].supportFlags & uVar6) != 0 &&
                              (uVar6 & preferenceFlags) != 0);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      p_Var2 = (_List_node_base *)operator_new(0x18);
      p_Var2[1]._M_next = (_List_node_base *)CONCAT44(iVar3,-iVar9);
      std::__detail::_List_node_base::_M_hook(p_Var2);
      psVar1 = &(possibleResources->
                super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)resourceCount);
  }
  p_Var2 = (_List_node_base *)possibleResources;
  if (requirementFlags != 0) {
    do {
      p_Var2 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)possibleResources) break;
      if ((rsrcList->list[*(int *)((long)&p_Var2[1]._M_next + 4)].supportFlags & requirementFlags) <
          requirementFlags) {
        __filename = p_Var2 + 1;
        if (p_Var2 == (possibleResources->
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                      _M_impl._M_node.super__List_node_base._M_next) {
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (possibleResources,(char *)__filename);
          p_Var2 = (possibleResources->
                   super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl._M_node.super__List_node_base._M_next;
        }
        else {
          p_Var2 = p_Var2->_M_prev;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (possibleResources,(char *)__filename);
        }
      }
    } while (p_Var2 != (_List_node_base *)possibleResources);
  }
  iVar3 = -6;
  if ((possibleResources->
      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
      _M_size != 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int filterResources(int* resourceList,
                    int resourceCount,
                    long preferenceFlags,
                    long requirementFlags,
                    PairedList* possibleResources) {

    // First determine a list of possible resources
    if (resourceList == NULL || resourceCount == 0) { // No list given
        for(int i=0; i<rsrcList->length; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[i].supportFlags), // Score
                i)); // ID
    } else {
        for(int i=0; i<resourceCount; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[resourceList[i]].supportFlags), // Score
                resourceList[i])); // ID
    }

    if (requirementFlags != 0) { // If requirements given do restriction
        for(PairedList::iterator it = possibleResources->begin();
            it != possibleResources->end(); ++it) {
            int resource = (*it).second;
            long resourceFlag = rsrcList->list[resource].supportFlags;
            if ( (resourceFlag & requirementFlags) < requirementFlags) {
                if(it==possibleResources->begin()){
                    possibleResources->remove(*(it));
                    it=possibleResources->begin();
                }else
                    possibleResources->remove(*(it--));
            }
            if(it==possibleResources->end())
                break;
        }
    }

    if (possibleResources->size() == 0) {
        return BEAGLE_ERROR_NO_RESOURCE;
    }

    return BEAGLE_SUCCESS;
}